

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityPrintFloat(UNITY_DOUBLE input_number)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int local_3c;
  double dStack_38;
  int exponent;
  double divide;
  UNITY_INT32 integer_part_1;
  UNITY_INT32 divisor_1;
  UNITY_INT32 fraction_part;
  UNITY_UINT32 integer_part;
  UNITY_INT32 divisor;
  UNITY_DOUBLE number;
  UNITY_DOUBLE input_number_local;
  
  _integer_part = input_number;
  if (input_number < 0.0) {
    putchar(0x2d);
    _integer_part = -input_number;
  }
  if (NAN(_integer_part)) {
    UnityPrint("NaN");
  }
  else {
    iVar3 = 1;
    if ((long)_integer_part < 0) {
      iVar3 = -1;
    }
    iVar1 = 0;
    if (ABS(_integer_part) == INFINITY) {
      iVar1 = iVar3;
    }
    if (iVar1 == 0) {
      if ((5e-07 < _integer_part) || (_integer_part <= 0.0)) {
        if (4294967295.9999995 <= _integer_part) {
          local_3c = 9;
          for (dStack_38 = 10.0; 999999999.5 <= _integer_part / dStack_38;
              dStack_38 = dStack_38 * 10.0) {
            local_3c = local_3c + 1;
          }
          divide._4_4_ = (uint)(_integer_part / dStack_38 + 0.5);
          if ((((_integer_part / dStack_38 < (double)(int)divide._4_4_) &&
               (_integer_part / dStack_38 - (double)(int)(divide._4_4_ - 1) <= 0.5)) &&
              ((divide._4_4_ & 1) == 1)) && (_integer_part < 1e+22)) {
            divide._4_4_ = divide._4_4_ - 1;
          }
          putchar((int)divide._4_4_ / 100000000 + 0x30);
          UnityPrintDecimalAndNumberWithLeadingZeros((int)divide._4_4_ % 100000000,10000000);
          putchar(0x65);
          putchar(0x2b);
          if (local_3c < 10) {
            putchar(0x30);
          }
          UnityPrintNumber((long)local_3c);
        }
        else {
          uVar2 = (ulong)_integer_part;
          divisor_1 = (UNITY_INT32)uVar2;
          integer_part_1 =
               (UNITY_INT32)((_integer_part - (double)(uVar2 & 0xffffffff)) * 1000000.0 + 0.5);
          if ((((_integer_part - (double)(uVar2 & 0xffffffff)) * 1000000.0 < (double)integer_part_1)
              && ((_integer_part - (double)(uVar2 & 0xffffffff)) * 1000000.0 +
                  -(double)(int)(integer_part_1 - 1) <= 0.5)) &&
             (((integer_part_1 & 1U) == 1 && (_integer_part < 1e+22)))) {
            integer_part_1 = integer_part_1 - 1;
          }
          if (integer_part_1 == 1000000) {
            integer_part_1 = 0;
            divisor_1 = divisor_1 + 1;
          }
          UnityPrintNumberUnsigned((ulong)(uint)divisor_1);
          UnityPrintDecimalAndNumberWithLeadingZeros(integer_part_1,100000);
        }
      }
      else {
        UnityPrint("0.000000...");
      }
    }
    else {
      UnityPrintLen("Infinity",3);
    }
  }
  return;
}

Assistant:

void UnityPrintFloat(const UNITY_DOUBLE input_number)
{
    UNITY_DOUBLE number;

    if (input_number < 0)
    {
        UNITY_OUTPUT_CHAR('-');
        number = -input_number;
    } else
    {
        number = input_number;
    }

    if (isnan(number)) UnityPrint(UnityStrNaN);
    else if (isinf(number)) UnityPrintLen(UnityStrInf, 3);
    else if (number <= 0.0000005 && number > 0) UnityPrint("0.000000..."); /* Small number */
    else if (number < 4294967295.9999995) /* Rounded result fits in 32 bits, "%.6f" format */
    {
        const UNITY_INT32 divisor = 1000000/10;
        UNITY_UINT32 integer_part = (UNITY_UINT32)number;
        UNITY_INT32 fraction_part = (UNITY_INT32)((number - (UNITY_DOUBLE)integer_part)*1000000.0 + 0.5);
        /* Double precision calculation gives best performance for six rounded decimal places */
        ROUND_TIES_TO_EVEN(number, fraction_part, (number - (UNITY_DOUBLE)integer_part)*1000000.0);

        if (fraction_part == 1000000) /* Carry across the decimal point */
        {
            fraction_part = 0;
            integer_part += 1;
        }

        UnityPrintNumberUnsigned(integer_part);
        UnityPrintDecimalAndNumberWithLeadingZeros(fraction_part, divisor);
    }
    else /* Number is larger, use exponential format of 9 digits, "%.8e" */
    {
        const UNITY_INT32 divisor = 1000000000/10;
        UNITY_INT32 integer_part;
        UNITY_DOUBLE_TYPE divide = 10.0;
        int exponent = 9;

        while (number / divide >= 1000000000.0 - 0.5)
        {
            divide *= 10;
            exponent++;
        }
        integer_part = (UNITY_INT32)(number / divide + 0.5);
        /* Double precision calculation required for float, to produce 9 rounded digits */
        ROUND_TIES_TO_EVEN(number, integer_part, number / divide);

        UNITY_OUTPUT_CHAR('0' + integer_part / divisor);
        UnityPrintDecimalAndNumberWithLeadingZeros(integer_part % divisor, divisor / 10);
        UNITY_OUTPUT_CHAR('e');
        UNITY_OUTPUT_CHAR('+');
        if (exponent < 10) UNITY_OUTPUT_CHAR('0');
        UnityPrintNumber(exponent);
    }
}